

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O1

void __thiscall NaStateSpaceModel::SetMatrices(NaStateSpaceModel *this,NaMatrix *mA,NaMatrix *mB)

{
  NaMatrix *this_00;
  NaMatrix *this_01;
  NaMatrix *this_02;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  
  iVar1 = (*mA->_vptr_NaMatrix[7])(mA);
  if (iVar1 != 0) {
    iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
    if (iVar1 != 0) {
      iVar1 = (*mB->_vptr_NaMatrix[7])(mB);
      if (iVar1 != 0) {
        iVar1 = (*mB->_vptr_NaMatrix[6])(mB);
        if (iVar1 != 0) {
          iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
          iVar2 = (*mA->_vptr_NaMatrix[7])(mA);
          if (iVar1 == iVar2) {
            iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
            iVar2 = (*mB->_vptr_NaMatrix[6])(mB);
            if (iVar1 == iVar2) {
              this_00 = &this->A;
              NaMatrix::operator=(this_00,mA);
              this_01 = &this->B;
              NaMatrix::operator=(this_01,mB);
              this_02 = &this->C;
              uVar3 = NaMatrix::dim_rows(this_00);
              uVar4 = NaMatrix::dim_cols(this_00);
              NaMatrix::new_dim(this_02,uVar3,uVar4);
              NaMatrix::init_diag(this_02,1.0);
              uVar3 = NaMatrix::dim_rows(this_02);
              uVar4 = NaMatrix::dim_cols(this_01);
              NaMatrix::new_dim(&this->D,uVar3,uVar4);
              NaMatrix::init_zero(&this->D);
              uVar3 = NaMatrix::dim_rows(this_00);
              this->n = uVar3;
              uVar3 = NaMatrix::dim_rows(this_02);
              this->m = uVar3;
              uVar3 = NaMatrix::dim_cols(this_01);
              this->k = uVar3;
              NaUnit::Assign(&this->super_NaUnit,uVar3,this->m,0);
              return;
            }
          }
        }
      }
    }
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 2;
  __cxa_throw(puVar5,&NaException::typeinfo,0);
}

Assistant:

void
NaStateSpaceModel::SetMatrices (const NaMatrix& mA,
				const NaMatrix& mB)
{
    if(!(mA.dim_cols() > 0 && mA.dim_rows() > 0 &&
         mB.dim_cols() > 0 && mB.dim_rows() > 0 &&
         mA.dim_rows() == mA.dim_cols() &&
         mA.dim_rows() == mB.dim_rows())){
         throw(na_size_mismatch);
    }

    A = mA;
    B = mB;
    C.new_dim(A.dim_rows(), A.dim_cols());
    C.init_diag(1.0);
    D.new_dim(C.dim_rows(), B.dim_cols());
    D.init_zero();

    n = A.dim_rows();
    m = C.dim_rows();
    k = B.dim_cols();

    Assign(k, m);
}